

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.cpp
# Opt level: O1

void __thiscall xscript::parser::ast_node::print(ast_node *this,int indent)

{
  pointer puVar1;
  __node_base_ptr p_Var2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  _Hash_node_base *p_Var6;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *child;
  pointer puVar7;
  
  iVar5 = indent;
  if (0 < indent) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  p_Var6 = (_Hash_node_base *)0x0;
  p_Var2 = std::
           _Hashtable<xscript::parser::type_t,_std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<xscript::parser::type_t>,_std::hash<xscript::parser::type_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     ((_Hashtable<xscript::parser::type_t,_std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_xscript::parser::type_t,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<xscript::parser::type_t>,_std::hash<xscript::parser::type_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)type_names,(ulong)this->type % (ulong)type_names._8_8_,&this->type,
                      (ulong)this->type);
  if (p_Var2 != (__node_base_ptr)0x0) {
    p_Var6 = p_Var2->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    pcVar4 = "\x1b[97mUNKNOWN_AST_NODE\x1b[0m";
    lVar3 = 0x19;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[97m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)p_Var6[3]._M_nxt,(long)p_Var6[2]._M_nxt);
    if (this->type == TOKEN) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \x1b[90m",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(this->token).literal._M_str,(this->token).literal._M_len);
    }
    pcVar4 = "\x1b[0m";
    lVar3 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  puVar7 = (this->children).
           super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->children).
           super__Vector_base<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>,_std::allocator<std::unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar1) {
    do {
      print((puVar7->_M_t).
            super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
            ._M_t.
            super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
            .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>._M_head_impl,indent + 2);
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  return;
}

Assistant:

void ast_node::print(int indent) {
    for (int i = 0 ; i < indent ; i++) {
        std::cout << " ";
    }
    auto it = type_names.find(type);
    if (it != type_names.end()) {
        std::cout << COLOR_WHITE << it->second;
        if (type == TOKEN) {
            std::cout << " " COLOR_GRAY << token.literal;
        }
        std::cout << COLOR_RESET << std::endl;
    } else {
        std::cout << COLOR_WHITE "UNKNOWN_AST_NODE" COLOR_RESET << std::endl;
    }

    for (auto & child : children) {
        child->print(indent + 2);
    }
}